

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  xmlCharEncoding xVar1;
  int iVar2;
  xmlChar *name;
  xmlCharEncodingHandlerPtr encoder;
  xmlOutputBufferPtr buf;
  undefined8 in_RCX;
  char *encoding;
  
  encoding = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),
                              filename == (char *)0x0 || cur == (xmlDocPtr)0x0);
  iVar2 = -1;
  if (filename != (char *)0x0 && cur != (xmlDocPtr)0x0) {
    xmlInitParser();
    name = htmlGetMetaEncoding(cur);
    if (name == (xmlChar *)0x0) {
      encoder = xmlFindCharEncodingHandler("HTML");
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        encoder = xmlFindCharEncodingHandler("ascii");
      }
    }
    else {
      xVar1 = xmlParseCharEncoding((char *)name);
      if (xVar1 == XML_CHAR_ENCODING_UTF8) {
        encoder = (xmlCharEncodingHandlerPtr)0x0;
      }
      else {
        encoder = xmlFindCharEncodingHandler((char *)name);
        if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
          encoding = "unknown encoding %s\n";
          encoder = (xmlCharEncodingHandlerPtr)0x0;
          __xmlSimpleError(7,0x57b,(xmlNodePtr)0x0,"unknown encoding %s\n",(char *)name);
        }
      }
    }
    buf = xmlOutputBufferCreateFilename(filename,encoder,cur->compression);
    if (buf != (xmlOutputBufferPtr)0x0) {
      htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,encoding,1);
      iVar2 = xmlOutputBufferClose(buf);
      return iVar2;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
		htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
	}
    } else {
        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL) return(0);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}